

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-types.c
# Opt level: O1

void fy_parse_eventp_recycle(fy_parser *fyp,fy_eventp *fyep)

{
  list_head *plVar1;
  fy_token *fyt;
  
  if (fyep == (fy_eventp *)0x0 || fyp == (fy_parser *)0x0) {
    return;
  }
  switch((fyep->e).type) {
  case FYET_STREAM_START:
  case FYET_STREAM_END:
  case FYET_DOCUMENT_END:
  case FYET_MAPPING_END:
  case FYET_SEQUENCE_END:
  case FYET_ALIAS:
    fyt = (fyep->e).field_1.document_start.document_start;
    break;
  case FYET_DOCUMENT_START:
    fy_token_unref((fyep->e).field_1.document_start.document_start);
    fy_document_state_unref((fyep->e).field_1.document_start.document_state);
    goto switchD_0013b267_default;
  case FYET_MAPPING_START:
  case FYET_SEQUENCE_START:
  case FYET_SCALAR:
    fy_token_unref((fyep->e).field_1.document_start.document_start);
    fy_token_unref((fyep->e).field_1.scalar.tag);
    fyt = (fyep->e).field_1.scalar.value;
    break;
  default:
    goto switchD_0013b267_default;
  }
  fy_token_unref(fyt);
switchD_0013b267_default:
  if ((fyp->field_0x70 & 1) == 0) {
    if (fyep != (fy_eventp *)0x0) {
      plVar1 = (fyp->recycled_eventp)._lh.next;
      plVar1->prev = &fyep->node;
      (fyep->node).next = plVar1;
      (fyep->node).prev = &(fyp->recycled_eventp)._lh;
      (fyp->recycled_eventp)._lh.next = &fyep->node;
    }
    return;
  }
  free(fyep);
  return;
}

Assistant:

void fy_parse_eventp_recycle(struct fy_parser *fyp, struct fy_eventp *fyep) {
    struct fy_event *fye;

    if (!fyp || !fyep)
        return;

    fye = &fyep->e;
    switch (fye->type) {
        case FYET_NONE:
            break;
        case FYET_STREAM_START:
            fy_token_unref(fye->stream_start.stream_start);
            break;
        case FYET_STREAM_END:
            fy_token_unref(fye->stream_end.stream_end);
            break;
        case FYET_DOCUMENT_START:
            fy_token_unref(fye->document_start.document_start);
            fy_document_state_unref(fye->document_start.document_state);
            break;
        case FYET_DOCUMENT_END:
            fy_token_unref(fye->document_end.document_end);
            break;
        case FYET_MAPPING_START:
            fy_token_unref(fye->mapping_start.anchor);
            fy_token_unref(fye->mapping_start.tag);
            fy_token_unref(fye->mapping_start.mapping_start);
            break;
        case FYET_MAPPING_END:
            fy_token_unref(fye->mapping_end.mapping_end);
            break;
        case FYET_SEQUENCE_START:
            fy_token_unref(fye->sequence_start.anchor);
            fy_token_unref(fye->sequence_start.tag);
            fy_token_unref(fye->sequence_start.sequence_start);
            break;
        case FYET_SEQUENCE_END:
            fy_token_unref(fye->sequence_end.sequence_end);
            break;
        case FYET_SCALAR:
            fy_token_unref(fye->scalar.anchor);
            fy_token_unref(fye->scalar.tag);
            fy_token_unref(fye->scalar.value);
            break;
        case FYET_ALIAS:
            fy_token_unref(fye->alias.anchor);
            break;
    }

    fy_parse_eventp_recycle_simple(fyp, fyep);
}